

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_5::checkColor(TestLog *log,TextureLevel *screen,Vec4 *color)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  MessageBuilder *pMVar4;
  ConstPixelBufferAccess local_338;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  LogImage local_2c0;
  MessageBuilder local_220;
  Vector<bool,_4> local_9c;
  Vector<float,_4> local_98;
  undefined1 local_88 [8];
  Vec4 diff;
  undefined1 local_50 [8];
  Vec4 pixel;
  int x;
  int y;
  Vec4 threshold;
  Vec4 *color_local;
  TextureLevel *screen_local;
  TestLog *log_local;
  
  threshold.m_data._8_8_ = color;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.01,0.01,0.01,1.0);
  pixel.m_data[3] = 0.0;
  do {
    fVar1 = pixel.m_data[3];
    iVar3 = tcu::TextureLevel::getHeight(screen);
    if (iVar3 <= (int)fVar1) {
      return true;
    }
    for (pixel.m_data[2] = 0.0; fVar1 = pixel.m_data[2], iVar3 = tcu::TextureLevel::getWidth(screen)
        , (int)fVar1 < iVar3; pixel.m_data[2] = (float)((int)pixel.m_data[2] + 1)) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)(diff.m_data + 2),screen);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_50,(int)&diff + 8,(int)pixel.m_data[2],
                 (int)pixel.m_data[3]);
      tcu::operator-((tcu *)&local_98,(Vector<float,_4> *)local_50,
                     (Vector<float,_4> *)threshold.m_data._8_8_);
      tcu::abs<float,4>((tcu *)local_88,&local_98);
      tcu::lessThanEqual<float,4>
                ((tcu *)&local_9c,(Vector<float,_4> *)local_88,(Vector<float,_4> *)&x);
      bVar2 = tcu::boolAll<4>(&local_9c);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        tcu::TestLog::operator<<(&local_220,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_220,
                            (char (*) [52])"Unexpected color values read from screen expected: ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(Vector<float,_4> *)threshold.m_data._8_8_);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_220);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"Screen",&local_2e1)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Screen",&local_309)
        ;
        tcu::TextureLevel::getAccess(&local_338,screen);
        tcu::LogImage::LogImage
                  (&local_2c0,&local_2e0,&local_308,&local_338,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(log,&local_2c0);
        tcu::LogImage::~LogImage(&local_2c0);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
        return false;
      }
    }
    pixel.m_data[3] = (float)((int)pixel.m_data[3] + 1);
  } while( true );
}

Assistant:

bool checkColor (tcu::TestLog& log, const tcu::TextureLevel& screen, const tcu::Vec4& color)
{
	const tcu::Vec4 threshold(0.01f, 0.01f, 0.01f, 1.00f);

	for (int y = 0; y < screen.getHeight(); y++)
	{
		for (int x = 0; x < screen.getWidth(); x++)
		{
			const tcu::Vec4	pixel(screen.getAccess().getPixel(x, y));
			const tcu::Vec4	diff(abs(pixel - color));

			if (!boolAll(lessThanEqual(diff, threshold)))
			{
				log << TestLog::Message << "Unexpected color values read from screen expected: " << color << TestLog::EndMessage;
				log << TestLog::Image("Screen", "Screen", screen.getAccess());
				return false;
			}
		}
	}

	return true;
}